

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DictionaryMLT<true,_true>::new_suffix_id_(DictionaryMLT<false,_false> *this)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  long in_RDI;
  uint32_t i;
  uint32_t suffix_id;
  uint32_t suffix_id_1;
  value_type *in_stack_ffffffffffffff98;
  vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  uint local_3c;
  uint local_4;
  
  if (*(int *)(in_RDI + 0x28) == -1) {
    sVar2 = std::
            vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
            ::size((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                    *)(in_RDI + 0x10));
    local_4 = (uint)sVar2;
    make_unique<ddd::DaTrie<true,true,false>>();
    std::
    vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
    ::push_back(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::
    unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
    ::~unique_ptr((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                   *)in_stack_ffffffffffffffa0);
  }
  else {
    local_4 = *(uint *)(in_RDI + 0x28);
    make_unique<ddd::DaTrie<true,true,false>>();
    std::
    vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
    ::operator[]((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                  *)(in_RDI + 0x10),(ulong)local_4);
    std::
    unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
    ::operator=((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                 *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::
    unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
    ::~unique_ptr((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                   *)in_stack_ffffffffffffffa0);
    local_3c = *(uint *)(in_RDI + 0x28);
    do {
      local_3c = local_3c + 1;
      uVar3 = (ulong)local_3c;
      sVar2 = std::
              vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
              ::size((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                      *)(in_RDI + 0x10));
      if (sVar2 <= uVar3) goto LAB_0017d4e5;
      std::
      vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
      ::operator[]((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                    *)(in_RDI + 0x10),(ulong)local_3c);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                          *)0x17d4c4);
    } while (bVar1);
    *(uint *)(in_RDI + 0x28) = local_3c;
LAB_0017d4e5:
    if (*(uint *)(in_RDI + 0x28) == local_4) {
      *(undefined4 *)(in_RDI + 0x28) = 0xffffffff;
    }
  }
  return local_4;
}

Assistant:

uint32_t new_suffix_id_() {
    if (suffix_head_ == NOT_FOUND) {
      auto suffix_id = static_cast<uint32_t>(suffix_subtries_.size());
      suffix_subtries_.push_back(make_unique<SuffixTrieType>());
      return suffix_id;
    }

    auto suffix_id = suffix_head_;
    suffix_subtries_[suffix_id] = make_unique<SuffixTrieType>();

    for (auto i = suffix_head_ + 1; i < suffix_subtries_.size(); ++i) {
      if (!suffix_subtries_[i]) {
        suffix_head_ = i;
        break;
      }
    }
    if (suffix_head_ == suffix_id) {
      suffix_head_ = NOT_FOUND;
    }
    return suffix_id;
  }